

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O3

shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> __thiscall
skiwi::make_deep_copy<skiwi::alpha_conversion_data>
          (skiwi *this,shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *env)

{
  environment<skiwi::alpha_conversion_data> *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  element_type *this_00;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *outer;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> sVar5;
  undefined1 local_41;
  skiwi *local_40;
  element_type *local_38;
  
  peVar1 = (env->
           super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_38 = (element_type *)this;
  if (peVar1 == (environment<skiwi::alpha_conversion_data> *)0x0) {
    *(undefined8 *)this = 0;
    p_Var3 = (env->
             super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
  }
  else {
    *(undefined8 *)this = 0;
    local_40 = this + 8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<skiwi::environment<skiwi::alpha_conversion_data>,std::allocator<skiwi::environment<skiwi::alpha_conversion_data>>,skiwi::environment<skiwi::alpha_conversion_data>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_40,
               (environment<skiwi::alpha_conversion_data> **)this,
               (allocator<skiwi::environment<skiwi::alpha_conversion_data>_> *)&local_41,peVar1);
    peVar2 = ((*(environment<skiwi::alpha_conversion_data> **)this)->p_outer).
             super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    peVar1 = *(environment<skiwi::alpha_conversion_data> **)this;
    in_RDX._M_pi = extraout_RDX;
    while (peVar2 != (element_type *)0x0) {
      outer = &peVar1->p_outer;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002a0958;
      this_00 = (element_type *)(p_Var4 + 1);
      environment<skiwi::alpha_conversion_data>::environment(this_00,outer);
      (outer->
      super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = this_00;
      p_Var3 = (peVar1->p_outer).
               super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (peVar1->p_outer).
      super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var4;
      in_RDX._M_pi = extraout_RDX_00;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        this_00 = (outer->
                  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        in_RDX._M_pi = extraout_RDX_01;
      }
      peVar1 = this_00;
      peVar2 = (this_00->p_outer).
               super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    }
  }
  sVar5.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  sVar5.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_38;
  return (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>)
         sVar5.
         super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<environment<TEntry>> make_deep_copy(const std::shared_ptr<environment<TEntry>>& env)
  {
  if (!env.get())
    return env;
  std::shared_ptr<environment<TEntry>> out = std::make_shared<environment<TEntry>>(*env);
  //if (out->p_outer)
  //  out->p_outer = make_deep_copy(out->p_outer);
  auto* p_outer_copy = &(out->p_outer);
  while (*p_outer_copy)
    { // this loop is not tested anywhere yet
    *p_outer_copy = std::make_shared<environment<TEntry>>(*p_outer_copy);
    p_outer_copy = &((*p_outer_copy)->p_outer);
    }
  return out;
  }